

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_generator.cc
# Opt level: O2

string * __thiscall
grpc_cpp_generator::GetHeaderServices_abi_cxx11_
          (string *__return_storage_ptr__,grpc_cpp_generator *this,File *file,Parameters *params)

{
  Printer *printer;
  string *psVar1;
  int iVar2;
  mapped_type *pmVar3;
  int iVar4;
  allocator<char> local_b9;
  Printer *local_b8;
  key_type local_b0;
  string *local_90;
  File *local_88;
  key_type local_80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  (**(code **)(*(long *)this + 0x60))(&local_b8,this,__return_storage_ptr__,0x20);
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90 = __return_storage_ptr__;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  (**(code **)(*(long *)this + 0x38))(&local_b0,this);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"Package",&local_b9);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&local_80);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_b0);
  (**(code **)(*(long *)this + 0x38))(&local_b0,this);
  std::__cxx11::string::~string((string *)&local_b0);
  if (local_b0._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"Package",(allocator<char> *)&local_80);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_b0);
    std::__cxx11::string::append((char *)pmVar3);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  if (file[1].super_CommentHolder._vptr_CommentHolder != (_func_int **)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"services_namespace",(allocator<char> *)&local_80);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_b0);
    std::__cxx11::string::_M_assign((string *)pmVar3);
    std::__cxx11::string::~string((string *)&local_b0);
    (*local_b8->_vptr_Printer[2])(local_b8,&vars,"\nnamespace $services_namespace$ {\n\n");
  }
  iVar4 = 0;
  local_88 = file;
  while( true ) {
    iVar2 = (**(code **)(*(long *)this + 0x50))(this);
    psVar1 = local_90;
    printer = local_b8;
    if (iVar2 <= iVar4) break;
    (**(code **)(*(long *)this + 0x58))(&local_b0,this,iVar4);
    anon_unknown_3::PrintHeaderService(printer,(Service *)local_b0._M_dataplus._M_p,&vars);
    if ((CommentHolder *)local_b0._M_dataplus._M_p != (CommentHolder *)0x0) {
      (*(*(_func_int ***)local_b0._M_dataplus._M_p)[1])();
    }
    (*local_b8->_vptr_Printer[3])(local_b8,"\n");
    iVar4 = iVar4 + 1;
  }
  if (local_88[1].super_CommentHolder._vptr_CommentHolder != (_func_int **)0x0) {
    (*local_b8->_vptr_Printer[2])(local_b8,&vars,"}  // namespace $services_namespace$\n\n");
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  if (local_b8 != (Printer *)0x0) {
    (*local_b8->_vptr_Printer[1])();
  }
  return psVar1;
}

Assistant:

grpc::string GetHeaderServices(grpc_generator::File *file,
                               const Parameters &params) {
  grpc::string output;
  {
    // Scope the output stream so it closes and finalizes output to the string.
    auto printer = file->CreatePrinter(&output);
    std::map<grpc::string, grpc::string> vars;
    // Package string is empty or ends with a dot. It is used to fully qualify
    // method names.
    vars["Package"] = file->package();
    if (!file->package().empty()) { vars["Package"].append("."); }

    if (!params.services_namespace.empty()) {
      vars["services_namespace"] = params.services_namespace;
      printer->Print(vars, "\nnamespace $services_namespace$ {\n\n");
    }

    for (int i = 0; i < file->service_count(); ++i) {
      PrintHeaderService(printer.get(), file->service(i).get(), &vars);
      printer->Print("\n");
    }

    if (!params.services_namespace.empty()) {
      printer->Print(vars, "}  // namespace $services_namespace$\n\n");
    }
  }
  return output;
}